

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Glucose::SimpSolver::backwardSubsumptionCheck(SimpSolver *this,bool verbose)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  Lit *pLVar6;
  Clause *pCVar7;
  vec<unsigned_int> *pvVar8;
  byte in_SIL;
  long in_RDI;
  CRef unaff_retaddr;
  SimpSolver *in_stack_00000008;
  Lit in_stack_00000014;
  Lit l_1;
  int j;
  CRef *cs;
  vec<unsigned_int> *_cs;
  int i;
  Var best;
  Clause *c;
  CRef cr;
  Lit l;
  int deleted_literals;
  int subsumed;
  int cnt;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>
  *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>
  *in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff8b;
  Lit in_stack_ffffffffffffff8c;
  Lit in_stack_ffffffffffffff90;
  Lit in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  Lit local_60;
  int local_5c;
  uint *local_58;
  vec<unsigned_int> *local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *local_30;
  uint local_28;
  int local_24;
  uint local_20;
  uint local_1c;
  int local_18;
  byte local_11;
  
  local_11 = in_SIL & 1;
  local_18 = 0;
  local_1c = 0;
  local_20 = 0;
  do {
    do {
      iVar2 = Queue<unsigned_int>::size((Queue<unsigned_int> *)in_stack_ffffffffffffff50);
      bVar1 = true;
      if (iVar2 < 1) {
        iVar2 = *(int *)(in_RDI + 0x5a0);
        iVar3 = vec<Glucose::Lit>::size((vec<Glucose::Lit> *)(in_RDI + 0x288));
        bVar1 = iVar2 < iVar3;
      }
      if (!bVar1) {
        return true;
      }
      if ((*(byte *)(in_RDI + 0x460) & 1) != 0) {
        Queue<unsigned_int>::clear
                  ((Queue<unsigned_int> *)in_stack_ffffffffffffff50,
                   SUB41(in_stack_ffffffffffffff4c >> 0x18,0));
        iVar2 = vec<Glucose::Lit>::size((vec<Glucose::Lit> *)(in_RDI + 0x288));
        *(int *)(in_RDI + 0x5a0) = iVar2;
        return true;
      }
      iVar2 = Queue<unsigned_int>::size((Queue<unsigned_int> *)in_stack_ffffffffffffff50);
      if ((iVar2 == 0) &&
         (iVar2 = *(int *)(in_RDI + 0x5a0),
         iVar3 = vec<Glucose::Lit>::size((vec<Glucose::Lit> *)(in_RDI + 0x288)), iVar2 < iVar3)) {
        iVar2 = *(int *)(in_RDI + 0x5a0);
        *(int *)(in_RDI + 0x5a0) = iVar2 + 1;
        pLVar6 = vec<Glucose::Lit>::operator[]((vec<Glucose::Lit> *)(in_RDI + 0x288),iVar2);
        local_24 = pLVar6->x;
        pCVar7 = ClauseAllocator::operator[]
                           ((ClauseAllocator *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        pLVar6 = Clause::operator[](pCVar7,0);
        pLVar6->x = local_24;
        ClauseAllocator::operator[]
                  ((ClauseAllocator *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        Clause::calcAbstraction((Clause *)in_stack_ffffffffffffff60);
        Queue<unsigned_int>::insert
                  ((Queue<unsigned_int> *)
                   CONCAT44(in_stack_ffffffffffffff94.x,in_stack_ffffffffffffff90.x),
                   in_stack_ffffffffffffff8c.x);
      }
      local_28 = Queue<unsigned_int>::peek((Queue<unsigned_int> *)0x1250f3);
      Queue<unsigned_int>::pop((Queue<unsigned_int> *)in_stack_ffffffffffffff50);
      local_30 = (OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *)
                 ClauseAllocator::operator[]
                           ((ClauseAllocator *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      uVar4 = Clause::mark((Clause *)local_30);
    } while (uVar4 != 0);
    if ((((local_11 & 1) != 0) && (1 < *(int *)(in_RDI + 0x28))) &&
       (iVar2 = local_18 + 1, iVar3 = local_18 % 1000, local_18 = iVar2, iVar3 == 0)) {
      uVar5 = Queue<unsigned_int>::size((Queue<unsigned_int> *)in_stack_ffffffffffffff50);
      printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r",(ulong)uVar5,
             (ulong)local_1c,(ulong)local_20);
    }
    pLVar6 = Clause::operator[]((Clause *)local_30,0);
    local_38 = pLVar6->x;
    local_34 = var((Lit)local_38);
    for (local_3c = 1; iVar2 = local_3c, iVar3 = Clause::size((Clause *)local_30), iVar2 < iVar3;
        local_3c = local_3c + 1) {
      in_stack_ffffffffffffff60 =
           (OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *)
           (in_RDI + 0x4f8);
      pLVar6 = Clause::operator[]((Clause *)local_30,local_3c);
      local_44 = pLVar6->x;
      local_40 = var((Lit)local_44);
      pvVar8 = OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::
               operator[](in_stack_ffffffffffffff50,
                          (int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      iVar2 = vec<unsigned_int>::size(pvVar8);
      pvVar8 = OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::
               operator[](in_stack_ffffffffffffff50,
                          (int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      iVar3 = vec<unsigned_int>::size(pvVar8);
      if (iVar2 < iVar3) {
        pLVar6 = Clause::operator[]((Clause *)local_30,local_3c);
        local_48 = pLVar6->x;
        local_34 = var((Lit)local_48);
      }
    }
    local_50 = OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::lookup
                         (in_stack_ffffffffffffff60,
                          (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    local_58 = Glucose::vec::operator_cast_to_unsigned_int_((vec *)local_50);
    local_5c = 0;
    while ((in_stack_ffffffffffffff5c = local_5c, iVar2 = vec<unsigned_int>::size(local_50),
           in_stack_ffffffffffffff5c < iVar2 &&
           (uVar4 = Clause::mark((Clause *)local_30), uVar4 == 0))) {
      pCVar7 = ClauseAllocator::operator[]
                         ((ClauseAllocator *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      uVar4 = Clause::mark(pCVar7);
      if ((uVar4 == 0) && (local_58[local_5c] != local_28)) {
        if (*(int *)(in_RDI + 0x4b4) != -1) {
          pCVar7 = ClauseAllocator::operator[]
                             ((ClauseAllocator *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c
                             );
          iVar2 = Clause::size(pCVar7);
          if (*(int *)(in_RDI + 0x4b4) <= iVar2) goto LAB_001254d9;
        }
        in_stack_ffffffffffffff50 = local_30;
        ClauseAllocator::operator[]((ClauseAllocator *)local_30,in_stack_ffffffffffffff4c);
        local_60 = Clause::subsumes((Clause *)
                                    CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                    (Clause *)
                                    CONCAT44(in_stack_ffffffffffffff94.x,in_stack_ffffffffffffff90.x
                                            ));
        in_stack_ffffffffffffff9c = 0xfffffffe;
        bVar1 = Lit::operator==(&local_60,(Lit)0xfffffffe);
        if (bVar1) {
          local_1c = local_1c + 1;
          removeClause((SimpSolver *)
                       CONCAT44(in_stack_ffffffffffffff94.x,in_stack_ffffffffffffff90.x),
                       in_stack_ffffffffffffff8c.x,(bool)in_stack_ffffffffffffff8b);
        }
        else {
          in_stack_ffffffffffffff98 = 0xffffffff;
          bVar1 = Lit::operator!=(&local_60,(Lit)0xffffffff);
          if (bVar1) {
            local_20 = local_20 + 1;
            in_stack_ffffffffffffff4c = local_58[local_5c];
            in_stack_ffffffffffffff90.x = local_60.x;
            in_stack_ffffffffffffff94 = operator~(local_60);
            bVar1 = strengthenClause(in_stack_00000008,unaff_retaddr,in_stack_00000014);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              return false;
            }
            in_stack_ffffffffffffff8c.x = local_60.x;
            iVar2 = var(local_60);
            if (iVar2 == local_34) {
              local_5c = local_5c + -1;
            }
          }
        }
      }
LAB_001254d9:
      local_5c = local_5c + 1;
    }
  } while( true );
}

Assistant:

bool SimpSolver::backwardSubsumptionCheck(bool verbose)
{
    int cnt = 0;
    int subsumed = 0;
    int deleted_literals = 0;
    assert(decisionLevel() == 0);

    while (subsumption_queue.size() > 0 || bwdsub_assigns < trail.size()){

        // Empty subsumption queue and return immediately on user-interrupt:
        if (asynch_interrupt){
            subsumption_queue.clear();
            bwdsub_assigns = trail.size();
            break; }

        // Check top-level assignments by creating a dummy clause and placing it in the queue:
        if (subsumption_queue.size() == 0 && bwdsub_assigns < trail.size()){
            Lit l = trail[bwdsub_assigns++];
            ca[bwdsub_tmpunit][0] = l;
            ca[bwdsub_tmpunit].calcAbstraction();
            subsumption_queue.insert(bwdsub_tmpunit); }

        CRef    cr = subsumption_queue.peek(); subsumption_queue.pop();
        Clause& c  = ca[cr];

        if (c.mark()) continue;

        if (verbose && verbosity >= 2 && cnt++ % 1000 == 0)
            printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r", subsumption_queue.size(), subsumed, deleted_literals);

        assert(c.size() > 1 || value(c[0]) == l_True);    // Unit-clauses should have been propagated before this point.

        // Find best variable to scan:
        Var best = var(c[0]);
        for (int i = 1; i < c.size(); i++)
            if (occurs[var(c[i])].size() < occurs[best].size())
                best = var(c[i]);

        // Search all candidates:
        vec<CRef>& _cs = occurs.lookup(best);
        CRef*       cs = (CRef*)_cs;

        for (int j = 0; j < _cs.size(); j++)
            if (c.mark())
                break;
            else if (!ca[cs[j]].mark() &&  cs[j] != cr && (subsumption_lim == -1 || ca[cs[j]].size() < subsumption_lim)){
                Lit l = c.subsumes(ca[cs[j]]);

                if (l == lit_Undef)
                    subsumed++, removeClause(cs[j]);
                else if (l != lit_Error){
                    deleted_literals++;

                    if (!strengthenClause(cs[j], ~l))
                        return false;

                    // Did current candidate get deleted from cs? Then check candidate at index j again:
                    if (var(l) == best)
                        j--;
                }
            }
    }

    return true;
}